

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* fmt::v5::to_wstring<int>(int *value)

{
  size_t in_RCX;
  void *__buf;
  int *in_RSI;
  container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_RDI;
  container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  buf;
  wstring *str;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff78;
  locale_ref loc;
  back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> in_stack_ffffffffffffff90;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_60 [4];
  byte local_11;
  int *local_10;
  
  local_11 = 0;
  loc.locale_ = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  internal::
  container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::container_buffer(in_RDI,in_stack_ffffffffffffff78);
  back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_> *)
             in_stack_ffffffffffffff90.container,(basic_buffer<wchar_t> *)loc.locale_);
  internal::locale_ref::locale_ref((locale_ref *)&stack0xffffffffffffff90);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::basic_writer
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *
             )in_RDI,(back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>)
                     in_stack_ffffffffffffff90.container,loc);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
            (local_60,*local_10,__buf,in_RCX);
  local_11 = 1;
  internal::
  container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~container_buffer((container_buffer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       *)0x19df71);
  if ((local_11 & 1) == 0) {
    std::__cxx11::wstring::~wstring((wstring *)loc.locale_);
  }
  return in_RDI;
}

Assistant:

std::wstring to_wstring(const T &value) {
  std::wstring str;
  internal::container_buffer<std::wstring> buf(str);
  wwriter(buf).write(value);
  return str;
}